

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_decompress.c
# Opt level: O1

_Bool build_decode_table(u32 *decode_table,u8 *lens,uint num_syms,u32 *decode_results,
                        uint table_bits,uint max_codeword_len,u16 *sorted_syms,uint *table_bits_ret)

{
  u32 uVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ushort *puVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint len_counts [16];
  uint offsets [16];
  
  uVar9 = (ulong)max_codeword_len;
  memset(len_counts,0,(ulong)max_codeword_len * 4 + 4);
  if (num_syms != 0) {
    uVar8 = 0;
    do {
      len_counts[lens[uVar8]] = len_counts[lens[uVar8]] + 1;
      uVar8 = uVar8 + 1;
    } while (num_syms != uVar8);
  }
  if (1 < max_codeword_len) {
    do {
      max_codeword_len = (uint)uVar9;
      if (len_counts[uVar9] != 0) goto LAB_00104c23;
      uVar9 = (ulong)(max_codeword_len - 1);
    } while (1 < max_codeword_len - 1);
    max_codeword_len = 1;
  }
LAB_00104c23:
  if (table_bits_ret != (uint *)0x0) {
    if (max_codeword_len < table_bits) {
      table_bits = max_codeword_len;
    }
    *table_bits_ret = table_bits;
  }
  offsets[0] = 0;
  offsets[1] = len_counts[0];
  if (max_codeword_len < 2) {
    iVar7 = 0;
    uVar9 = 1;
  }
  else {
    iVar7 = 0;
    uVar9 = 1;
    do {
      uVar10 = len_counts[uVar9];
      len_counts[0] = len_counts[0] + uVar10;
      offsets[uVar9 + 1] = len_counts[0];
      uVar9 = uVar9 + 1;
      iVar7 = uVar10 + iVar7 * 2;
    } while (max_codeword_len != uVar9);
    iVar7 = iVar7 * 2;
  }
  uVar10 = iVar7 + len_counts[uVar9];
  if (num_syms != 0) {
    uVar9 = 0;
    do {
      uVar3 = offsets[lens[uVar9]];
      offsets[lens[uVar9]] = uVar3 + 1;
      sorted_syms[uVar3] = (u16)uVar9;
      uVar9 = uVar9 + 1;
    } while (num_syms != uVar9);
  }
  uVar3 = 1 << ((byte)max_codeword_len & 0x1f);
  if (uVar10 < uVar3 || uVar10 == uVar3) {
    puVar11 = sorted_syms + offsets[0];
    bVar5 = (byte)table_bits;
    if (uVar10 < uVar3) {
      if (uVar10 == 0) {
        uVar9 = 0;
      }
      else {
        if (uVar10 != 1 << ((byte)max_codeword_len - 1 & 0x1f)) {
          return false;
        }
        if (len_counts[1] != 1) {
          return false;
        }
        uVar9 = (ulong)*puVar11;
      }
      uVar1 = decode_results[uVar9];
      uVar10 = 1;
      do {
        decode_table[uVar10 - 1] = uVar1 + 0x101;
        _Var2 = true;
        uVar3 = uVar10 >> (bVar5 & 0x1f);
        uVar10 = uVar10 + 1;
      } while (uVar3 == 0);
    }
    else {
      uVar9 = 0;
      do {
        uVar3 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar3;
        uVar10 = len_counts[uVar9];
      } while (uVar10 == 0);
      if (table_bits < uVar3) {
        uVar8 = 0;
      }
      else {
        uVar3 = 1 << ((byte)uVar3 & 0x1f);
        uVar8 = 0;
        do {
          do {
            uVar12 = (uint)uVar8;
            decode_table[uVar8] = (uint)uVar9 * 0x101 + decode_results[*puVar11];
            uVar15 = uVar3 - 1;
            if (uVar12 == uVar15) {
              if ((uint)uVar9 < table_bits) {
                do {
                  memcpy(decode_table + uVar3,decode_table,(ulong)uVar3 << 2);
                  uVar3 = uVar3 * 2;
                  uVar13 = (int)uVar9 + 1;
                  uVar9 = (ulong)uVar13;
                } while (table_bits != uVar13);
                uVar9 = (ulong)table_bits;
              }
            }
            else {
              uVar13 = 0x1f;
              if ((uVar15 ^ uVar12) != 0) {
                for (; (uVar15 ^ uVar12) >> uVar13 == 0; uVar13 = uVar13 - 1) {
                }
              }
              uVar8 = (ulong)((1 << ((byte)uVar13 & 0x1f)) - 1U & uVar12 | 1 << (uVar13 & 0x1f));
            }
            if (uVar12 == uVar15) goto LAB_00104ee8;
            puVar11 = puVar11 + 1;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
          do {
            uVar15 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar15;
            if (uVar15 <= table_bits) {
              memcpy(decode_table + uVar3,decode_table,(ulong)uVar3 << 2);
              uVar3 = uVar3 * 2;
            }
            uVar10 = len_counts[uVar15];
          } while (uVar10 == 0);
        } while (uVar15 <= table_bits);
      }
      uVar13 = 1 << (bVar5 & 0x1f);
      uVar3 = uVar13 - 1;
      uVar15 = 0xffffffff;
      uVar12 = 0;
      do {
        uVar16 = (uint)uVar8;
        uVar4 = uVar16 & uVar3;
        uVar6 = (uint)uVar9;
        uVar14 = uVar13;
        if (uVar4 != uVar15) {
          iVar7 = uVar6 - table_bits;
          uVar14 = 1 << ((byte)iVar7 & 0x1f);
          uVar15 = uVar10;
          uVar12 = uVar6;
          if (uVar10 < uVar14) {
            do {
              iVar7 = iVar7 + 1;
              uVar14 = 1 << ((byte)iVar7 & 0x1f);
              uVar15 = uVar15 * 2 + len_counts[uVar12 + 1];
              uVar12 = uVar12 + 1;
            } while (uVar15 < uVar14);
          }
          decode_table[uVar4] = uVar13 << 0x10 | table_bits | iVar7 << 8 | 0xc000;
          uVar14 = uVar14 + uVar13;
          uVar15 = uVar4;
          uVar12 = uVar13;
        }
        uVar13 = uVar14;
        uVar1 = decode_results[*puVar11];
        uVar14 = (uVar16 >> (bVar5 & 0x1f)) + uVar12;
        do {
          decode_table[uVar14] = (uVar6 - table_bits) * 0x101 + uVar1;
          uVar14 = uVar14 + (1 << ((byte)(uVar6 - table_bits) & 0x1f));
        } while (uVar14 < uVar13);
        uVar4 = ~(-1 << ((byte)uVar9 & 0x1f));
        uVar14 = uVar16;
        if (uVar16 != uVar4) {
          uVar6 = 0x1f;
          if ((uVar16 ^ uVar4) != 0) {
            for (; (uVar16 ^ uVar4) >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          uVar10 = uVar10 - 1;
          while (uVar14 = (1 << ((byte)uVar6 & 0x1f)) - 1U & uVar16 | 1 << (uVar6 & 0x1f),
                uVar10 == 0) {
            uVar9 = (ulong)((int)uVar9 + 1);
            uVar10 = len_counts[uVar9];
          }
        }
        puVar11 = puVar11 + 1;
        uVar8 = (ulong)uVar14;
      } while (uVar16 != uVar4);
LAB_00104ee8:
      _Var2 = true;
    }
  }
  else {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

static bool
build_decode_table(u32 decode_table[],
		   const u8 lens[],
		   const unsigned num_syms,
		   const u32 decode_results[],
		   unsigned table_bits,
		   unsigned max_codeword_len,
		   u16 *sorted_syms,
		   unsigned *table_bits_ret)
{
	unsigned len_counts[DEFLATE_MAX_CODEWORD_LEN + 1];
	unsigned offsets[DEFLATE_MAX_CODEWORD_LEN + 1];
	unsigned sym;		/* current symbol */
	unsigned codeword;	/* current codeword, bit-reversed */
	unsigned len;		/* current codeword length in bits */
	unsigned count;		/* num codewords remaining with this length */
	u32 codespace_used;	/* codespace used out of '2^max_codeword_len' */
	unsigned cur_table_end; /* end index of current table */
	unsigned subtable_prefix; /* codeword prefix of current subtable */
	unsigned subtable_start;  /* start index of current subtable */
	unsigned subtable_bits;   /* log2 of current subtable length */

	/* Count how many codewords have each length, including 0. */
	for (len = 0; len <= max_codeword_len; len++)
		len_counts[len] = 0;
	for (sym = 0; sym < num_syms; sym++)
		len_counts[lens[sym]]++;

	/*
	 * Determine the actual maximum codeword length that was used, and
	 * decrease table_bits to it if allowed.
	 */
	while (max_codeword_len > 1 && len_counts[max_codeword_len] == 0)
		max_codeword_len--;
	if (table_bits_ret != NULL) {
		table_bits = MIN(table_bits, max_codeword_len);
		*table_bits_ret = table_bits;
	}

	/*
	 * Sort the symbols primarily by increasing codeword length and
	 * secondarily by increasing symbol value; or equivalently by their
	 * codewords in lexicographic order, since a canonical code is assumed.
	 *
	 * For efficiency, also compute 'codespace_used' in the same pass over
	 * 'len_counts[]' used to build 'offsets[]' for sorting.
	 */

	/* Ensure that 'codespace_used' cannot overflow. */
	STATIC_ASSERT(sizeof(codespace_used) == 4);
	STATIC_ASSERT(UINT32_MAX / (1U << (DEFLATE_MAX_CODEWORD_LEN - 1)) >=
		      DEFLATE_MAX_NUM_SYMS);

	offsets[0] = 0;
	offsets[1] = len_counts[0];
	codespace_used = 0;
	for (len = 1; len < max_codeword_len; len++) {
		offsets[len + 1] = offsets[len] + len_counts[len];
		codespace_used = (codespace_used << 1) + len_counts[len];
	}
	codespace_used = (codespace_used << 1) + len_counts[len];

	for (sym = 0; sym < num_syms; sym++)
		sorted_syms[offsets[lens[sym]]++] = sym;

	sorted_syms += offsets[0]; /* Skip unused symbols */

	/* lens[] is done being used, so we can write to decode_table[] now. */

	/*
	 * Check whether the lengths form a complete code (exactly fills the
	 * codespace), an incomplete code (doesn't fill the codespace), or an
	 * overfull code (overflows the codespace).  A codeword of length 'n'
	 * uses proportion '1/(2^n)' of the codespace.  An overfull code is
	 * nonsensical, so is considered invalid.  An incomplete code is
	 * considered valid only in two specific cases; see below.
	 */

	/* overfull code? */
	if (unlikely(codespace_used > (1U << max_codeword_len)))
		return false;

	/* incomplete code? */
	if (unlikely(codespace_used < (1U << max_codeword_len))) {
		u32 entry;
		unsigned i;

		/*
		 * The DEFLATE RFC explicitly allows the offset code to be
		 * incomplete in two cases: a code containing just 1 codeword,
		 * if that codeword has length 1; and a code containing no
		 * codewords.  Note: the list of offset codeword lengths is
		 * always nonempty, but lengths of 0 don't count as codewords.
		 *
		 * The RFC doesn't say whether the same cases are allowed for
		 * the litlen and pre codes.  It's actually impossible for no
		 * symbols to be used from these codes; however, it's
		 * technically possible for only one symbol to be used.  zlib
		 * allows 1 codeword for the litlen code, but not the precode.
		 * The RFC also doesn't say whether, when there is 1 codeword,
		 * that codeword is '0' or '1'.  zlib uses '0'.
		 *
		 * We accept what zlib accepts, plus a bit more.  First, we
		 * don't treat the precode more strictly than the litlen and
		 * offset codes.  There's no convincing reason to add a special
		 * case for the precode here.
		 *
		 * Second, we just map each allowed incompete code to a complete
		 * code with only real symbols.  To do this, we choose a symbol,
		 * either the used symbol (for codes with 1 codeword) or an
		 * arbitrary symbol (for empty codes), and give it both
		 * codewords '0' and '1'.  zlib instead uses a special ERROR
		 * symbol in the part of the codespace the code doesn't use.
		 * However, having an ERROR symbol reduces the performance of
		 * the Huffman decoder, for no real benefit.  Our approach also
		 * avoids having to decide whether '0' or '1' is correct.
		 *
		 * Like zlib, we still reject all incomplete codes that contain
		 * more than 1 codeword or a codeword length greater than 1.
		 */
		if (codespace_used == 0) {
			sym = 0; /* arbitrary */
		} else {
			if (codespace_used != (1U << (max_codeword_len - 1)) ||
			    len_counts[1] != 1)
				return false;
			sym = sorted_syms[0];
		}
		entry = make_decode_table_entry(decode_results, sym, 1);
		for (i = 0; i < (1U << table_bits); i++)
			decode_table[i] = entry;
		return true;
	}

	/*
	 * The lengths form a complete code.  Now, enumerate the codewords in
	 * lexicographic order and fill the decode table entries for each one.
	 *
	 * First, process all codewords with len <= table_bits.  Each one gets
	 * '2^(table_bits-len)' direct entries in the table.
	 *
	 * Since DEFLATE uses bit-reversed codewords, these entries aren't
	 * consecutive but rather are spaced '2^len' entries apart.  This makes
	 * filling them naively somewhat awkward and inefficient, since strided
	 * stores are less cache-friendly and preclude the use of word or
	 * vector-at-a-time stores to fill multiple entries per instruction.
	 *
	 * To optimize this, we incrementally double the table size.  When
	 * processing codewords with length 'len', the table is treated as
	 * having only '2^len' entries, so each codeword uses just one entry.
	 * Then, each time 'len' is incremented, the table size is doubled and
	 * the first half is copied to the second half.  This significantly
	 * improves performance over naively doing strided stores.
	 *
	 * Note that some entries copied for each table doubling may not have
	 * been initialized yet, but it doesn't matter since they're guaranteed
	 * to be initialized later (because the Huffman code is complete).
	 */
	codeword = 0;
	len = 1;
	while ((count = len_counts[len]) == 0)
		len++;
	cur_table_end = 1U << len;
	while (len <= table_bits) {
		/* Process all 'count' codewords with length 'len' bits. */
		do {
			unsigned bit;

			/* Fill the first entry for the current codeword. */
			decode_table[codeword] =
				make_decode_table_entry(decode_results,
							*sorted_syms++, len);

			if (codeword == cur_table_end - 1) {
				/* Last codeword (all 1's) */
				for (; len < table_bits; len++) {
					memcpy(&decode_table[cur_table_end],
					       decode_table,
					       cur_table_end *
						sizeof(decode_table[0]));
					cur_table_end <<= 1;
				}
				return true;
			}
			/*
			 * To advance to the lexicographically next codeword in
			 * the canonical code, the codeword must be incremented,
			 * then 0's must be appended to the codeword as needed
			 * to match the next codeword's length.
			 *
			 * Since the codeword is bit-reversed, appending 0's is
			 * a no-op.  However, incrementing it is nontrivial.  To
			 * do so efficiently, use the 'bsr' instruction to find
			 * the last (highest order) 0 bit in the codeword, set
			 * it, and clear any later (higher order) 1 bits.  But
			 * 'bsr' actually finds the highest order 1 bit, so to
			 * use it first flip all bits in the codeword by XOR'ing
			 * it with (1U << len) - 1 == cur_table_end - 1.
			 */
			bit = 1U << bsr32(codeword ^ (cur_table_end - 1));
			codeword &= bit - 1;
			codeword |= bit;
		} while (--count);

		/* Advance to the next codeword length. */
		do {
			if (++len <= table_bits) {
				memcpy(&decode_table[cur_table_end],
				       decode_table,
				       cur_table_end * sizeof(decode_table[0]));
				cur_table_end <<= 1;
			}
		} while ((count = len_counts[len]) == 0);
	}

	/* Process codewords with len > table_bits.  These require subtables. */
	cur_table_end = 1U << table_bits;
	subtable_prefix = -1;
	subtable_start = 0;
	for (;;) {
		u32 entry;
		unsigned i;
		unsigned stride;
		unsigned bit;

		/*
		 * Start a new subtable if the first 'table_bits' bits of the
		 * codeword don't match the prefix of the current subtable.
		 */
		if ((codeword & ((1U << table_bits) - 1)) != subtable_prefix) {
			subtable_prefix = (codeword & ((1U << table_bits) - 1));
			subtable_start = cur_table_end;
			/*
			 * Calculate the subtable length.  If the codeword has
			 * length 'table_bits + n', then the subtable needs
			 * '2^n' entries.  But it may need more; if fewer than
			 * '2^n' codewords of length 'table_bits + n' remain,
			 * then the length will need to be incremented to bring
			 * in longer codewords until the subtable can be
			 * completely filled.  Note that because the Huffman
			 * code is complete, it will always be possible to fill
			 * the subtable eventually.
			 */
			subtable_bits = len - table_bits;
			codespace_used = count;
			while (codespace_used < (1U << subtable_bits)) {
				subtable_bits++;
				codespace_used = (codespace_used << 1) +
					len_counts[table_bits + subtable_bits];
			}
			cur_table_end = subtable_start + (1U << subtable_bits);

			/*
			 * Create the entry that points from the main table to
			 * the subtable.
			 */
			decode_table[subtable_prefix] =
				((u32)subtable_start << 16) |
				HUFFDEC_EXCEPTIONAL |
				HUFFDEC_SUBTABLE_POINTER |
				(subtable_bits << 8) | table_bits;
		}

		/* Fill the subtable entries for the current codeword. */
		entry = make_decode_table_entry(decode_results, *sorted_syms++,
						len - table_bits);
		i = subtable_start + (codeword >> table_bits);
		stride = 1U << (len - table_bits);
		do {
			decode_table[i] = entry;
			i += stride;
		} while (i < cur_table_end);

		/* Advance to the next codeword. */
		if (codeword == (1U << len) - 1) /* last codeword (all 1's)? */
			return true;
		bit = 1U << bsr32(codeword ^ ((1U << len) - 1));
		codeword &= bit - 1;
		codeword |= bit;
		count--;
		while (count == 0)
			count = len_counts[++len];
	}
}